

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.hpp
# Opt level: O0

result<toml::basic_value<toml::type_config>,_toml::error_info> *
toml::detail::parse_bin_integer<toml::type_config>(location *loc,context<toml::type_config> *ctx)

{
  bool bVar1;
  size_type sVar2;
  region *r;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *com;
  iterator __first;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __last;
  value_type *pvVar3;
  context<toml::type_config> *in_RDX;
  result<toml::basic_value<toml::type_config>,_toml::error_info> *in_RDI;
  result<long,_toml::error_info> val;
  reverse_iterator<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  first_underscore;
  integer_format_info fmt;
  string str;
  region reg;
  spec *spec;
  location first;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffff7c8;
  region *prVar4;
  result<toml::basic_value<toml::type_config>,_toml::error_info> *in_stack_fffffffffffff7d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff7d8;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffff7e0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffff7e8;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffff7f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff7f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  __const_iterator in_stack_fffffffffffff800;
  __const_iterator in_stack_fffffffffffff808;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff810;
  region *in_stack_fffffffffffff828;
  location *loc_00;
  source_location *this_01;
  integer_format_info *in_stack_fffffffffffff860;
  integer_type in_stack_fffffffffffff868;
  basic_value<toml::type_config> *in_stack_fffffffffffff870;
  uint8_t base;
  result<toml::basic_value<toml::type_config>,_toml::error_info> *src;
  string *in_stack_fffffffffffff888;
  basic_value<toml::type_config> *in_stack_fffffffffffff8b8;
  location *in_stack_fffffffffffff8c0;
  sequence *in_stack_fffffffffffff8c8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_720 [4];
  undefined8 local_6b8;
  undefined8 uStack_6b0;
  undefined8 local_6a8;
  undefined8 in_stack_fffffffffffffa20;
  undefined8 in_stack_fffffffffffffa28;
  sequence *in_stack_fffffffffffffa30;
  string *in_stack_fffffffffffffa38;
  result<long,_toml::error_info> local_3f8;
  char *local_398;
  char *local_390;
  undefined1 local_379;
  char *local_378;
  char *local_370;
  char *local_368;
  char *local_358;
  undefined1 local_349;
  char *local_348;
  char *local_340;
  char *local_338;
  char *local_330;
  char *local_320;
  reverse_iterator<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_310 [3];
  undefined1 local_2f1;
  undefined1 local_2f0 [16];
  reverse_iterator<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_2e0;
  undefined1 local_2d1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2d0;
  undefined1 local_2c0;
  size_t local_2b8;
  region *local_2b0;
  undefined1 local_288 [183];
  allocator<char> local_1d1 [361];
  spec *local_68;
  context<toml::type_config> *local_18;
  
  src = in_RDI;
  local_18 = in_RDX;
  location::location((location *)in_stack_fffffffffffff7f0._M_current,
                     (location *)in_stack_fffffffffffff7e8._M_current);
  base = (uint8_t)((ulong)in_RDI >> 0x38);
  local_68 = context<toml::type_config>::toml_spec(local_18);
  syntax::bin_int((spec *)in_stack_fffffffffffff8c8);
  sequence::scan(in_stack_fffffffffffff8c8,in_stack_fffffffffffff8c0);
  sequence::~sequence((sequence *)in_stack_fffffffffffff7d0);
  bVar1 = region::is_ok((region *)0x6f38cc);
  if (bVar1) {
    region::as_string_abi_cxx11_(in_stack_fffffffffffff828);
    integer_format_info::integer_format_info
              ((integer_format_info *)in_stack_fffffffffffff7f0._M_current);
    local_2c0 = 1;
    this_01 = (source_location *)local_288;
    sVar2 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            size((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_01);
    r = (region *)(sVar2 - 2);
    local_2d0._8_8_ =
         CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::begin
                   ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    in_stack_fffffffffffff7c8._M_current);
    local_2d0._M_allocated_capacity =
         (size_type)
         CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::end
                   (in_stack_fffffffffffff7d8);
    local_2d1 = 0x5f;
    com = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)std::count<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,char>
                       (in_stack_fffffffffffff7f0,in_stack_fffffffffffff7e8,
                        in_stack_fffffffffffff7e0._M_current);
    local_2b8 = (long)r - (long)com;
    loc_00 = (location *)(local_2f0 + 8);
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::rbegin
              (in_stack_fffffffffffff7d8);
    prVar4 = (region *)local_2f0;
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::rend
              (in_stack_fffffffffffff7d8);
    local_2f1 = 0x5f;
    std::find<std::reverse_iterator<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>,char>
              ((reverse_iterator<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)in_stack_fffffffffffff808._M_current,
               (reverse_iterator<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)in_stack_fffffffffffff800._M_current,(char *)in_stack_fffffffffffff7f8);
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::rend
              (in_stack_fffffffffffff7d8);
    bVar1 = std::
            operator==<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ((reverse_iterator<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)in_stack_fffffffffffff7e0._M_current,
                       (reverse_iterator<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)in_stack_fffffffffffff7d8);
    if (((bVar1 ^ 0xffU) & 1) != 0) {
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::rbegin
                (in_stack_fffffffffffff7d8);
      CLI::std::
      reverse_iterator<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::reverse_iterator(local_310,&local_2e0);
      in_stack_fffffffffffff828 =
           (region *)
           std::
           distance<std::reverse_iterator<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>>
                     ((reverse_iterator<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)in_stack_fffffffffffff7f0._M_current,
                      (reverse_iterator<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)in_stack_fffffffffffff7e8._M_current);
      local_2b0 = in_stack_fffffffffffff828;
    }
    local_320 = (char *)CLI::std::__cxx11::
                        basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::begin
                                  (in_stack_fffffffffffff7c8._M_current);
    __gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>::__normal_iterator<char*>
              ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)in_stack_fffffffffffff7d0,
               (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)in_stack_fffffffffffff7c8._M_current);
    local_340 = (char *)CLI::std::__cxx11::
                        basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::begin
                                  (in_stack_fffffffffffff7c8._M_current);
    local_338 = (char *)std::next<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
                                  (in_stack_fffffffffffff7c8,0x6f3dc6);
    local_348 = (char *)CLI::std::__cxx11::
                        basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::end
                                  (in_stack_fffffffffffff7d8);
    local_349 = 0x31;
    local_330 = (char *)std::find<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,char>
                                  (in_stack_fffffffffffff7e8,in_stack_fffffffffffff7e0,
                                   (char *)in_stack_fffffffffffff7d8);
    __gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>::__normal_iterator<char*>
              ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)in_stack_fffffffffffff7d0,
               (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)in_stack_fffffffffffff7c8._M_current);
    __first = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              erase(in_stack_fffffffffffff7f8,in_stack_fffffffffffff808,in_stack_fffffffffffff800);
    this_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_288;
    local_358 = __first._M_current;
    local_370 = (char *)CLI::std::__cxx11::
                        basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::begin
                                  (in_stack_fffffffffffff7c8._M_current);
    local_378 = (char *)CLI::std::__cxx11::
                        basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::end
                                  (in_stack_fffffffffffff7d8);
    local_379 = 0x5f;
    __last = std::remove<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,char>
                       (in_stack_fffffffffffff7e8,in_stack_fffffffffffff7e0,
                        (char *)in_stack_fffffffffffff7d8);
    local_368 = __last._M_current;
    __gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>::__normal_iterator<char*>
              ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)in_stack_fffffffffffff7d0,
               (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)in_stack_fffffffffffff7c8._M_current);
    local_390 = (char *)CLI::std::__cxx11::
                        basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::end
                                  (in_stack_fffffffffffff7d8);
    __gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>::__normal_iterator<char*>
              ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)in_stack_fffffffffffff7d0,
               (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)in_stack_fffffffffffff7c8._M_current);
    local_398 = (char *)CLI::std::__cxx11::
                        basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::erase
                                  (this_00,__first._M_current,__last._M_current);
    bVar1 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            empty((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x6f3f52);
    if (bVar1) {
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
      operator=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                in_stack_fffffffffffff7d0,in_stack_fffffffffffff7c8._M_current);
    }
    region::region(prVar4,loc_00);
    source_location::source_location(this_01,r);
    type_config::parse_int(in_stack_fffffffffffff888,(source_location *)src,base);
    source_location::~source_location((source_location *)in_stack_fffffffffffff7d0);
    region::~region((region *)in_stack_fffffffffffff7d0);
    bVar1 = result<long,_toml::error_info>::is_ok(&local_3f8);
    if (bVar1) {
      pvVar3 = result<long,_toml::error_info>::as_ok((result<long,_toml::error_info> *)0x6f3fff);
      prVar4 = (region *)*pvVar3;
      in_stack_fffffffffffff7d0 =
           (result<toml::basic_value<toml::type_config>,_toml::error_info> *)
           &stack0xfffffffffffff960;
      integer_format_info::integer_format_info
                ((integer_format_info *)in_stack_fffffffffffff7d0,(integer_format_info *)prVar4);
      local_6b8 = 0;
      uStack_6b0 = 0;
      local_6a8 = 0;
      CLI::std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)0x6f4049);
      this = local_720;
      region::region((region *)in_stack_fffffffffffff7d0,prVar4);
      basic_value<toml::type_config>::basic_value
                (in_stack_fffffffffffff870,in_stack_fffffffffffff868,in_stack_fffffffffffff860,com,
                 (region_type *)this_01);
      ok<toml::basic_value<toml::type_config>>(in_stack_fffffffffffff8b8);
      result<toml::basic_value<toml::type_config>,_toml::error_info>::result
                (in_stack_fffffffffffff7d0,(success_type *)prVar4);
      success<toml::basic_value<toml::type_config>_>::~success
                ((success<toml::basic_value<toml::type_config>_> *)0x6f40c0);
      basic_value<toml::type_config>::~basic_value
                ((basic_value<toml::type_config> *)in_stack_fffffffffffff7d0);
      region::~region((region *)in_stack_fffffffffffff7d0);
      CLI::std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(this);
      integer_format_info::~integer_format_info((integer_format_info *)0x6f40f4);
    }
    else {
      location::operator=((location *)in_stack_fffffffffffff7d0,
                          (location *)in_stack_fffffffffffff7c8._M_current);
      result<long,_toml::error_info>::as_err((result<long,_toml::error_info> *)0x6f41f7);
      err<toml::error_info_const&>((error_info *)in_stack_fffffffffffff828);
      result<toml::basic_value<toml::type_config>,_toml::error_info>::result
                (in_stack_fffffffffffff7d0,(failure_type *)in_stack_fffffffffffff7c8._M_current);
      failure<toml::error_info>::~failure((failure<toml::error_info> *)0x6f422d);
    }
    local_288._32_4_ = 1;
    result<long,_toml::error_info>::~result((result<long,_toml::error_info> *)0x6f4280);
    integer_format_info::~integer_format_info((integer_format_info *)0x6f428d);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff7d0);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffff810,in_stack_fffffffffffff808._M_current,
               (allocator<char> *)in_stack_fffffffffffff800._M_current);
    syntax::bin_int((spec *)in_stack_fffffffffffff8c8);
    location::location((location *)in_stack_fffffffffffff7f0._M_current,
                       (location *)in_stack_fffffffffffff7e8._M_current);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffff810,in_stack_fffffffffffff808._M_current,
               (allocator<char> *)in_stack_fffffffffffff800._M_current);
    make_syntax_error<toml::detail::sequence>
              (in_stack_fffffffffffffa38,in_stack_fffffffffffffa30,
               (location *)in_stack_fffffffffffffa28,(string *)in_stack_fffffffffffffa20);
    err<toml::error_info>((error_info *)in_stack_fffffffffffff828);
    result<toml::basic_value<toml::type_config>,_toml::error_info>::result
              (in_stack_fffffffffffff7d0,(failure_type *)in_stack_fffffffffffff7c8._M_current);
    failure<toml::error_info>::~failure((failure<toml::error_info> *)0x6f39d8);
    error_info::~error_info((error_info *)in_stack_fffffffffffff7d0);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff7d0);
    std::allocator<char>::~allocator((allocator<char> *)(local_288 + 0x27));
    location::~location((location *)in_stack_fffffffffffff7d0);
    sequence::~sequence((sequence *)in_stack_fffffffffffff7d0);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff7d0);
    std::allocator<char>::~allocator(local_1d1);
    local_288._32_4_ = 1;
  }
  region::~region((region *)in_stack_fffffffffffff7d0);
  location::~location((location *)in_stack_fffffffffffff7d0);
  return src;
}

Assistant:

result<basic_value<TC>, error_info>
parse_bin_integer(location& loc, const context<TC>& ctx)
{
    const auto first = loc;
    const auto& spec = ctx.toml_spec();
    auto reg = syntax::bin_int(spec).scan(loc);
    if( ! reg.is_ok())
    {
        return err(make_syntax_error("toml::parse_bin_integer: "
            "invalid integer: bin_int must be like: 0b0101, 0b1111_0000",
            syntax::bin_int(spec), loc));
    }

    auto str = reg.as_string();

    integer_format_info fmt;
    fmt.fmt   = integer_format::bin;
    fmt.width = str.size() - 2 - static_cast<std::size_t>(std::count(str.begin(), str.end(), '_'));

    const auto first_underscore = std::find(str.rbegin(), str.rend(), '_');
    if(first_underscore != str.rend())
    {
        fmt.spacer = static_cast<std::size_t>(std::distance(str.rbegin(), first_underscore));
    }

    // skip prefix `0b` and zeros and underscores at the MSB
    str.erase(str.begin(), std::find(std::next(str.begin(), 2), str.end(), '1'));

    // remove all `_` before calling TC::parse_int
    str.erase(std::remove(str.begin(), str.end(), '_'), str.end());

    // 0b0000_0000 becomes empty.
    if(str.empty()) { str = "0"; }

    const auto val = TC::parse_int(str, source_location(region(loc)), 2);
    if(val.is_ok())
    {
        return ok(basic_value<TC>(val.as_ok(), std::move(fmt), {}, std::move(reg)));
    }
    else
    {
        loc = first;
        return err(val.as_err());
    }
}